

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc_extension.cpp
# Opt level: O2

void duckdb::JemallocExtension::FlushAll(void)

{
  idx_t arena_idx;
  string purge_arena;
  string local_28;
  
  SetJemallocCTL("thread.tcache.flush");
  PurgeArenaString_abi_cxx11_(&local_28,(duckdb *)0x1000,arena_idx);
  SetJemallocCTL(local_28._M_dataplus._M_p);
  SetJemallocCTL("thread.peak.reset");
  ::std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void JemallocExtension::FlushAll() {
	// Flush thread-local cache
	SetJemallocCTL("thread.tcache.flush");

	// Flush all arenas
	const auto purge_arena = PurgeArenaString(MALLCTL_ARENAS_ALL);
	SetJemallocCTL(purge_arena.c_str());

	// Reset the peak after resetting
	SetJemallocCTL("thread.peak.reset");
}